

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcmc_main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float fVar1;
  float fVar2;
  pointer pfVar3;
  double dVar4;
  element_type *peVar5;
  bool bVar6;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar7;
  char *pcVar8;
  typed_value<std::vector<float,_std::allocator<float>_>,_char> *ptVar9;
  typed_value<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_char> *ptVar10;
  typed_value<unsigned_int,_char> *ptVar11;
  size_type sVar12;
  size_type sVar13;
  size_type sVar14;
  size_type sVar15;
  size_type sVar16;
  ostream *this;
  pointer puVar17;
  uint r_2;
  ulong uVar18;
  uint r;
  long lVar19;
  ostream *poVar20;
  uint uVar21;
  ulong uVar22;
  pointer pvVar23;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint s_1;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  uint i;
  ulong uVar27;
  uint sampling_steps;
  allocator_type local_17b5;
  uint seed;
  float_vec_t cooling_schedule_kwargs;
  allocator_type local_1791;
  uint_mat_t marginal;
  shared_ptr<metropolis_hasting> algorithm;
  value_type_conflict2 local_1754;
  uint sampling_frequency;
  uint burn_in;
  uint_vec_t n;
  string cooling_schedule;
  uint_vec_t memberships_init;
  edge_list_t edge_list;
  uint_vec_t memberships;
  float_mat_t p;
  adj_list_t adj_list;
  blockmodel_t blockmodel;
  float_vec_t probabilities;
  string edge_list_path;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_15d8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_15c0;
  _Vector_base<float,_std::allocator<float>_> local_15a8;
  _Vector_base<float,_std::allocator<float>_> local_1590;
  _Vector_base<float,_std::allocator<float>_> local_1578;
  _Vector_base<float,_std::allocator<float>_> local_1560;
  _Vector_base<float,_std::allocator<float>_> local_1548;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_1530;
  string local_1518;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_14f8;
  variables_map var_map;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_14c8 [144];
  options_description description;
  mt19937 engine;
  
  edge_list_path._M_dataplus._M_p = (pointer)&edge_list_path.field_2;
  edge_list_path._M_string_length = 0;
  edge_list_path.field_2._M_local_buf[0] = '\0';
  probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cooling_schedule._M_dataplus._M_p = (pointer)&cooling_schedule.field_2;
  cooling_schedule._M_string_length = 0;
  cooling_schedule.field_2._M_local_buf[0] = '\0';
  engine._M_x[0]._0_4_ = 0;
  std::vector<float,_std::allocator<float>_>::vector
            (&cooling_schedule_kwargs,2,(value_type_conflict1 *)&engine,(allocator_type *)&var_map);
  seed = 0;
  std::__cxx11::string::string((string *)&engine,"Options",(allocator *)&var_map);
  boost::program_options::options_description::options_description
            (&description,(string *)&engine,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&engine);
  _var_map = boost::program_options::options_description::add_options();
  ptVar7 = boost::program_options::value<std::__cxx11::string>(&edge_list_path);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&var_map,(value_semantic *)"edge_list_path,e",(char *)ptVar7);
  ptVar9 = boost::program_options::value<std::vector<float,std::allocator<float>>>(&probabilities);
  ptVar9->m_multitoken = true;
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"probabilities,P",(char *)ptVar9);
  ptVar10 = boost::program_options::value<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      (&n);
  ptVar10->m_multitoken = true;
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"n,n",(char *)ptVar10);
  ptVar11 = boost::program_options::value<unsigned_int>(&burn_in);
  blockmodel.adj_list_ptr_._0_4_ = 1000;
  ptVar11 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar11,(uint *)&blockmodel);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"burn_in,b",(char *)ptVar11);
  ptVar11 = boost::program_options::value<unsigned_int>(&sampling_steps);
  edge_list.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(edge_list.
                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1000);
  ptVar11 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar11,(uint *)&edge_list);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"sampling_steps,t",(char *)ptVar11);
  ptVar11 = boost::program_options::value<unsigned_int>(&sampling_frequency);
  adj_list.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 10;
  ptVar11 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar11,(uint *)&adj_list);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"sampling_frequency,f",(char *)ptVar11);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,"randomize,r");
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,"use_ppm,u");
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,"use_single_vertex,s");
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,"maximize,m");
  ptVar7 = boost::program_options::value<std::__cxx11::string>(&cooling_schedule);
  std::__cxx11::string::string((string *)&engine,"exponential",(allocator *)&memberships_init);
  ptVar7 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&engine);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"cooling_schedule,c",(char *)ptVar7);
  ptVar9 = boost::program_options::value<std::vector<float,std::allocator<float>>>
                     (&cooling_schedule_kwargs);
  ptVar9->m_multitoken = true;
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"cooling_schedule_kwargs,a",(char *)ptVar9);
  ptVar11 = boost::program_options::value<unsigned_int>(&seed);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"seed,d",(char *)ptVar11);
  boost::program_options::options_description_easy_init::operator()(pcVar8,"help,h");
  std::__cxx11::string::~string((string *)&engine);
  boost::program_options::variables_map::variables_map(&var_map);
  local_14f8.super_function_base.vtable = (vtable_base *)0x0;
  local_14f8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_14f8.super_function_base.functor._8_8_ = 0;
  local_14f8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)&engine,argc,argv,&description,0,&local_14f8);
  boost::program_options::store((basic_parsed_options *)&engine,&var_map,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&engine);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_14f8);
  boost::program_options::notify(&var_map);
  std::__cxx11::string::string((string *)&engine,"help",(allocator *)&blockmodel);
  sVar12 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_14c8,(key_type *)&engine);
  std::__cxx11::string::~string((string *)&engine);
  if ((argc == 1) || (sVar12 != 0)) {
    std::operator<<((ostream *)&std::cout,
                    "MCMC algorithms for the SBM (output intermediate states)\n");
    poVar20 = std::operator<<((ostream *)&std::cout,"Usage:\n");
    std::__cxx11::string::string((string *)&edge_list,*argv,(allocator *)&adj_list);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&blockmodel,
                   "  ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &edge_list);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&engine,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&blockmodel,
                   " [--option_1=value] [--option_s2=value] ...\n");
    std::operator<<(poVar20,(string *)&engine);
    std::__cxx11::string::~string((string *)&engine);
    std::__cxx11::string::~string((string *)&blockmodel);
    std::__cxx11::string::~string((string *)&edge_list);
    iVar25 = 0;
    boost::program_options::operator<<((ostream *)&std::cout,&description);
    goto LAB_0011bc75;
  }
  std::__cxx11::string::string((string *)&engine,"edge_list_path",(allocator *)&blockmodel);
  sVar12 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_14c8,(key_type *)&engine);
  std::__cxx11::string::~string((string *)&engine);
  poVar20 = (ostream *)&std::cout;
  if (sVar12 == 0) {
    pcVar8 = "edge_list_path is required (-e flag)\n";
  }
  else {
    std::__cxx11::string::string((string *)&engine,"n",(allocator *)&blockmodel);
    sVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count(local_14c8,(key_type *)&engine);
    std::__cxx11::string::~string((string *)&engine);
    if (sVar12 != 0) {
      std::__cxx11::string::string((string *)&engine,"randomize",(allocator *)&blockmodel);
      sVar12 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_14c8,(key_type *)&engine);
      std::__cxx11::string::~string((string *)&engine);
      std::__cxx11::string::string((string *)&engine,"use_ppm",(allocator *)&blockmodel);
      sVar13 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_14c8,(key_type *)&engine);
      std::__cxx11::string::~string((string *)&engine);
      std::__cxx11::string::string((string *)&engine,"use_single_vertex",(allocator *)&blockmodel);
      sVar14 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_14c8,(key_type *)&engine);
      std::__cxx11::string::~string((string *)&engine);
      std::__cxx11::string::string((string *)&engine,"maximize",(allocator *)&blockmodel);
      sVar15 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_14c8,(key_type *)&engine);
      std::__cxx11::string::~string((string *)&engine);
      if (sVar15 != 0) {
        std::__cxx11::string::string
                  ((string *)&engine,"cooling_schedule_kwargs",(allocator *)&blockmodel);
        sVar16 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                 ::count(local_14c8,(key_type *)&engine);
        std::__cxx11::string::~string((string *)&engine);
        bVar6 = std::operator==(&cooling_schedule,"exponential");
        if (sVar16 != 0) {
          if (bVar6) {
            if (*cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start <= 0.0) {
              std::operator<<((ostream *)&std::cerr,
                              "Invalid cooling schedule argument for linear schedule: T_0 must be grater than 0.\n"
                             );
              this = (ostream *)std::operator<<((ostream *)&std::cerr,"Passed value: T_0=");
            }
            else {
              if ((0.0 < cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_start[1]) &&
                 (cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[1] < 1.0)) goto LAB_0011af7d;
              std::operator<<((ostream *)&std::cerr,
                              "Invalid cooling schedule argument for exponential schedule: alpha must be in ]0,1[.\n"
                             );
              this = (ostream *)std::operator<<((ostream *)&std::cerr,"Passed value: alpha=");
LAB_0011bc1e:
              cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>._M_impl
                   .super__Vector_impl_data._M_start + 1;
            }
          }
          else {
            bVar6 = std::operator==(&cooling_schedule,"linear");
            if (!bVar6) {
              bVar6 = std::operator==(&cooling_schedule,"logarithmic");
              if (bVar6) {
                if (*cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start <= 0.0) {
                  std::operator<<((ostream *)&std::cerr,
                                  "Invalid cooling schedule argument for logarithmic schedule: c must be greater than 0.\n"
                                 );
                  this = (ostream *)std::operator<<((ostream *)&std::cerr,"Passed value: c=");
                  goto LAB_0011bc54;
                }
                if (cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_start[1] <= 0.0) {
                  std::operator<<((ostream *)&std::cerr,
                                  "Invalid cooling schedule argument for logarithmic schedule: d must be greater than 0.\n"
                                 );
                  this = (ostream *)std::operator<<((ostream *)&std::cerr,"Passed value: d=");
                  goto LAB_0011bc1e;
                }
              }
              else {
                bVar6 = std::operator==(&cooling_schedule,"constant");
                if (!bVar6) {
                  pcVar8 = 
                  "Invalid cooling schedule. Options are exponential, linear, logarithmic.\n";
                  poVar20 = (ostream *)&std::cerr;
                  goto LAB_0011bc6a;
                }
                if (*cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start <= 0.0) {
                  std::operator<<((ostream *)&std::cerr,
                                  "Invalid cooling schedule argument for constant schedule: temperature must be greater than 0.\n"
                                 );
                  this = (ostream *)std::operator<<((ostream *)&std::cerr,"Passed value: T=");
                  goto LAB_0011bc54;
                }
              }
              goto LAB_0011af7d;
            }
            fVar1 = *cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (fVar1 <= 0.0) {
              std::operator<<((ostream *)&std::cerr,
                              "Invalid cooling schedule argument for linear schedule: T_0 must be grater than 0.\n"
                             );
              this = (ostream *)std::operator<<((ostream *)&std::cerr,"Passed value: T_0=");
            }
            else {
              fVar2 = cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_start[1];
              if ((fVar2 <= 0.0) || (fVar1 < fVar2)) {
                std::operator<<((ostream *)&std::cerr,
                                "Invalid cooling schedule argument for linear schedule: eta must be in ]0, T_0].\n"
                               );
                poVar20 = std::operator<<((ostream *)&std::cerr,"Passed value: T_0=");
                poVar20 = (ostream *)
                          std::ostream::operator<<
                                    ((ostream *)poVar20,
                                     *cooling_schedule_kwargs.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start);
                this = (ostream *)std::operator<<(poVar20,", eta=");
                goto LAB_0011bc1e;
              }
              if (fVar2 * (float)sampling_steps <= fVar1) goto LAB_0011af7d;
              std::operator<<((ostream *)&std::cerr,
                              "Invalid cooling schedule argument for linear schedule: eta * sampling_steps must be smaller or equal to T_0.\n"
                             );
              poVar20 = std::operator<<((ostream *)&std::cerr,"Passed value: eta*sampling_steps=");
              poVar20 = (ostream *)
                        std::ostream::operator<<
                                  ((ostream *)poVar20,
                                   (float)sampling_steps *
                                   cooling_schedule_kwargs.
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_start[1]);
              this = (ostream *)std::operator<<(poVar20,", T_0=");
            }
          }
LAB_0011bc54:
          poVar20 = (ostream *)
                    std::ostream::operator<<
                              (this,*cooling_schedule_kwargs.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start);
          pcVar8 = "\n";
          goto LAB_0011bc6a;
        }
        if (bVar6) {
          cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[0] = 1.0;
          cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[1] = 0.99;
        }
        bVar6 = std::operator==(&cooling_schedule,"linear");
        if (bVar6) {
          *cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start = (float)(sampling_steps + 1);
          cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[1] = 1.0;
        }
        bVar6 = std::operator==(&cooling_schedule,"logarithmic");
        if (bVar6) {
          cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[0] = 1.0;
          cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[1] = 1.0;
        }
        bVar6 = std::operator==(&cooling_schedule,"constant");
        if (bVar6) {
          *cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start = 1.0;
        }
      }
LAB_0011af7d:
      std::__cxx11::string::string((string *)&engine,"seed",(allocator *)&blockmodel);
      sVar16 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_14c8,(key_type *)&engine);
      std::__cxx11::string::~string((string *)&engine);
      if (sVar16 == 0) {
        seed = std::chrono::_V2::system_clock::now();
      }
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed(&engine,(ulong)seed);
      uVar22 = 1;
      uVar27 = (long)n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      uVar26 = uVar27 & 0xffffffff;
      uVar21 = 0;
      for (uVar18 = 0; uVar26 != uVar18; uVar18 = uVar18 + 1) {
        uVar21 = uVar21 + n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar18];
      }
      edge_list.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      edge_list.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      edge_list.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_1518,(string *)&edge_list_path);
      load_edge_list(&edge_list,&local_1518);
      std::__cxx11::string::~string((string *)&local_1518);
      edge_to_adj(&adj_list,&edge_list,uVar21);
      if (edge_list.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          edge_list.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        edge_list.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             edge_list.
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      memberships_init.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      memberships_init.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      memberships_init.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar21 = 0;
      for (puVar17 = n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          puVar17 !=
          n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish; puVar17 = puVar17 + 1) {
        uVar21 = uVar21 + *puVar17;
      }
      blockmodel.adj_list_ptr_._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&memberships_init,(ulong)uVar21,(value_type_conflict2 *)&blockmodel);
      iVar25 = 0;
      for (uVar21 = 0;
          (ulong)uVar21 <
          (ulong)((long)n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2); uVar21 = uVar21 + 1) {
        for (uVar18 = 0;
            uVar18 < n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar21]; uVar18 = uVar18 + 1) {
          memberships_init.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[(uint)(iVar25 + (int)uVar18)] = uVar21;
        }
        iVar25 = n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar21] + iVar25;
      }
      blockmodel_t::blockmodel_t
                (&blockmodel,&memberships_init,(uint)uVar27,
                 (uint)(((long)adj_list.
                               super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        CONCAT44(adj_list.
                                 super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 adj_list.
                                 super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._0_4_)) / 0x30),&adj_list
                );
      if (memberships_init.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          memberships_init.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        memberships_init.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             memberships_init.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (sVar12 != 0) {
        blockmodel_t::shuffle(&blockmodel,&engine);
      }
      uVar18 = uVar27 & 0xffffffff;
      memberships.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&marginal,uVar18,
                 (value_type_conflict1 *)&memberships,(allocator_type *)&algorithm);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::vector(&p,uVar18,(value_type *)&marginal,(allocator_type *)&local_1754);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&marginal);
      if (sVar13 == 0) {
        lVar19 = 0;
        for (uVar22 = 0; uVar22 != uVar26; uVar22 = uVar22 + 1) {
          pfVar3 = p.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar22].
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start;
          for (uVar24 = 0; uVar26 != uVar24; uVar24 = uVar24 + 1) {
            pfVar3[uVar24] =
                 probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[(uint)((int)lVar19 + (int)uVar24)];
          }
          lVar19 = lVar19 + uVar27;
        }
      }
      else {
        for (uVar27 = 0; uVar27 != uVar26; uVar27 = uVar27 + 1) {
          iVar25 = (int)uVar22;
          pvVar23 = p.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar22;
          pfVar3 = p.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar27].
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start;
          pfVar3[uVar27] =
               *probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
          for (; uVar22 < uVar26; uVar22 = uVar22 + 1) {
            fVar1 = probabilities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[1];
            pfVar3[uVar22] = fVar1;
            (pvVar23->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar27] = fVar1;
            pvVar23 = pvVar23 + 1;
          }
          uVar22 = (ulong)(iVar25 + 1);
        }
      }
      algorithm.super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      algorithm.super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (sVar14 != 0 && sVar13 == 0) {
        std::make_shared<mh_single_vertex_sbm>();
        std::__shared_ptr<metropolis_hasting,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<metropolis_hasting,(__gnu_cxx::_Lock_policy)2> *)&algorithm,
                   (__shared_ptr<mh_single_vertex_sbm,_(__gnu_cxx::_Lock_policy)2> *)&marginal);
LAB_0011b47b:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &marginal.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        if (sVar13 != 0 && sVar14 != 0) {
          std::make_shared<mh_single_vertex_ppm>();
          std::__shared_ptr<metropolis_hasting,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<metropolis_hasting,(__gnu_cxx::_Lock_policy)2> *)&algorithm,
                     (__shared_ptr<mh_single_vertex_ppm,_(__gnu_cxx::_Lock_policy)2> *)&marginal);
          goto LAB_0011b47b;
        }
        if (sVar13 == 0 && sVar14 == 0) {
          std::make_shared<mh_vertices_swap_sbm>();
          std::__shared_ptr<metropolis_hasting,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<metropolis_hasting,(__gnu_cxx::_Lock_policy)2> *)&algorithm,
                     (__shared_ptr<mh_vertices_swap_sbm,_(__gnu_cxx::_Lock_policy)2> *)&marginal);
          goto LAB_0011b47b;
        }
        if (sVar13 != 0 && sVar14 == 0) {
          std::make_shared<mh_vertices_swap_ppm>();
          std::__shared_ptr<metropolis_hasting,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<metropolis_hasting,(__gnu_cxx::_Lock_policy)2> *)&algorithm,
                     (__shared_ptr<mh_vertices_swap_ppm,_(__gnu_cxx::_Lock_policy)2> *)&marginal);
          goto LAB_0011b47b;
        }
      }
      poVar20 = std::operator<<((ostream *)&std::clog,"edge_list_path: ");
      poVar20 = std::operator<<(poVar20,(string *)&edge_list_path);
      std::operator<<(poVar20,"\n");
      std::operator<<((ostream *)&std::clog,"probabilities:\n");
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::vector(&local_1530,&p);
      output_mat<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>
                (&local_1530,(ostream *)&std::clog);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&local_1530);
      poVar20 = std::operator<<((ostream *)&std::clog,"sizes (g=");
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
      std::operator<<(poVar20,"): ");
      for (puVar17 = n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          puVar17 !=
          n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish; puVar17 = puVar17 + 1) {
        poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
        std::operator<<(poVar20," ");
      }
      std::operator<<((ostream *)&std::clog,"\n");
      poVar20 = std::operator<<((ostream *)&std::clog,"burn_in: ");
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
      std::operator<<(poVar20,"\n");
      poVar20 = std::operator<<((ostream *)&std::clog,"sampling_steps: ");
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
      std::operator<<(poVar20,"\n");
      poVar20 = std::operator<<((ostream *)&std::clog,"sampling_frequency: ");
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
      std::operator<<(poVar20,"\n");
      pcVar8 = "maximize: true\n";
      if (sVar15 == 0) {
        pcVar8 = "maximize: false\n";
      }
      std::operator<<((ostream *)&std::clog,pcVar8);
      pcVar8 = "use_ppm: true\n";
      if (sVar13 == 0) {
        pcVar8 = "use_ppm: false\n";
      }
      std::operator<<((ostream *)&std::clog,pcVar8);
      pcVar8 = "use_single_vertex: true\n";
      if (sVar14 == 0) {
        pcVar8 = "use_single_vertex: false\n";
      }
      std::operator<<((ostream *)&std::clog,pcVar8);
      pcVar8 = "randomize: true\n";
      if (sVar12 == 0) {
        pcVar8 = "randomize: false\n";
      }
      std::operator<<((ostream *)&std::clog,pcVar8);
      if (sVar15 != 0) {
        poVar20 = std::operator<<((ostream *)&std::clog,"cooling_schedule: ");
        poVar20 = std::operator<<(poVar20,(string *)&cooling_schedule);
        std::operator<<(poVar20,"\n");
        std::operator<<((ostream *)&std::clog,"cooling_schedule_kwargs: ");
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_1548,&cooling_schedule_kwargs);
        output_vec<std::vector<float,std::allocator<float>>>
                  ((vector<float,_std::allocator<float>_> *)&local_1548,(ostream *)&std::clog);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_1548);
      }
      poVar20 = std::operator<<((ostream *)&std::clog,"seed: ");
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
      std::operator<<(poVar20,"\n");
      lVar19 = CONCAT44(adj_list.
                        super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                        adj_list.
                        super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._0_4_);
      local_1754 = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&memberships,uVar18,&local_1754,&local_17b5);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(&marginal,
               ((long)adj_list.
                      super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - lVar19) / 0x30,&memberships,
               &local_1791);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&memberships.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      if (sVar15 == 0) {
        dVar4 = metropolis_hasting::marginalize
                          (algorithm.
                           super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           ,&blockmodel,&marginal,&p,burn_in,sampling_frequency,sampling_steps,
                           &engine);
        uVar21 = blockmodel_t::get_N(&blockmodel);
        local_1754 = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&memberships,(ulong)uVar21,&local_1754,&local_17b5);
        for (uVar22 = 0; uVar21 = blockmodel_t::get_N(&blockmodel), uVar22 < uVar21;
            uVar22 = uVar22 + 1) {
          uVar21 = 0;
          for (uVar18 = 0; uVar26 != uVar18; uVar18 = uVar18 + 1) {
            puVar17 = marginal.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar22].
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (uVar21 < puVar17[uVar18]) {
              *(int *)(CONCAT44(memberships.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                memberships.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar22 * 4) =
                   (int)uVar18;
              uVar21 = puVar17[uVar18];
            }
          }
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_15d8,&memberships);
        output_vec<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_15d8,
                   (ostream *)&std::cout);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_15d8);
        std::operator<<((ostream *)&std::clog,"acceptance ratio ");
        poVar20 = std::ostream::_M_insert<double>(dVar4);
        std::operator<<(poVar20,"\n");
        this_00 = &memberships.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
      }
      else {
        bVar6 = std::operator==(&cooling_schedule,"exponential");
        peVar5 = algorithm.super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if (bVar6) {
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_1560,&cooling_schedule_kwargs);
          metropolis_hasting::anneal
                    (peVar5,&blockmodel,&p,exponential_schedule,(float_vec_t *)&local_1560,
                     sampling_steps,&engine);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_1560);
        }
        bVar6 = std::operator==(&cooling_schedule,"linear");
        peVar5 = algorithm.super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if (bVar6) {
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_1578,&cooling_schedule_kwargs);
          metropolis_hasting::anneal
                    (peVar5,&blockmodel,&p,linear_schedule,(float_vec_t *)&local_1578,sampling_steps
                     ,&engine);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_1578);
        }
        bVar6 = std::operator==(&cooling_schedule,"logarithmic");
        peVar5 = algorithm.super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if (bVar6) {
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_1590,&cooling_schedule_kwargs);
          metropolis_hasting::anneal
                    (peVar5,&blockmodel,&p,logarithmic_schedule,(float_vec_t *)&local_1590,
                     sampling_steps,&engine);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_1590);
        }
        bVar6 = std::operator==(&cooling_schedule,"constant");
        peVar5 = algorithm.super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if (bVar6) {
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_15a8,&cooling_schedule_kwargs);
          metropolis_hasting::anneal
                    (peVar5,&blockmodel,&p,constant_schedule,(float_vec_t *)&local_15a8,
                     sampling_steps,&engine);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_15a8);
        }
        blockmodel_t::get_memberships((uint_vec_t *)&local_15c0,&blockmodel);
        output_vec<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_15c0,
                   (ostream *)&std::cout);
        this_00 = &local_15c0;
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(this_00);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&marginal);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&algorithm.super___shared_ptr<metropolis_hasting,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&p);
      blockmodel_t::~blockmodel_t(&blockmodel);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&memberships_init.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::
      vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&adj_list);
      std::
      _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Vector_base(&edge_list.
                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     );
      iVar25 = 0;
      goto LAB_0011bc75;
    }
    pcVar8 = "n is required (-n flag)\n";
  }
LAB_0011bc6a:
  std::operator<<(poVar20,pcVar8);
  iVar25 = 1;
LAB_0011bc75:
  boost::program_options::variables_map::~variables_map(&var_map);
  boost::program_options::options_description::~options_description(&description);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&cooling_schedule_kwargs.super__Vector_base<float,_std::allocator<float>_>);
  std::__cxx11::string::~string((string *)&cooling_schedule);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&n.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&probabilities.super__Vector_base<float,_std::allocator<float>_>);
  std::__cxx11::string::~string((string *)&edge_list_path);
  return iVar25;
}

Assistant:

int main(int argc, char const *argv[]) {
    /* ~~~~~ Program options ~~~~~~~*/
    std::string edge_list_path;
    float_vec_t probabilities;
    uint_vec_t n;
    unsigned int burn_in;
    unsigned int sampling_steps;
    unsigned int sampling_frequency;
    bool randomize = false;
    bool use_ppm = false;
    bool use_single_vertex = false;
    bool maximize = false;
    std::string cooling_schedule;
    float_vec_t cooling_schedule_kwargs(2,0);
    unsigned int seed = 0;

    po::options_description description("Options");
    description.add_options()
    ("edge_list_path,e", po::value<std::string>(&edge_list_path), 
        "Path to edge list file.")
    ("probabilities,P", po::value<float_vec_t>(&probabilities)->multitoken(), 
        "In normal mode (SBM): probability matrix in row major order. In PPM mode: p_in followed by p_out.")
    ("n,n", po::value<uint_vec_t>(&n)->multitoken(), 
        "Block sizes vector.\n")
    ("burn_in,b", po::value<unsigned int>(&burn_in)->default_value(1000),
        "Burn-in time.")
    ("sampling_steps,t", po::value<unsigned int>(&sampling_steps)->default_value(1000),
        "Number of sampling steps in marginalize mode. Length of the simulated annealing process.")
    ("sampling_frequency,f", po::value<unsigned int>(&sampling_frequency)->default_value(10),
        "Number of step between each sample in marginalize mode. Unused in likelihood maximization mode.")
    ("randomize,r",
        "Randomize initial block state.")
    ("use_ppm,u",
        "Use PPM transition ratios (defaults to SBM).")
    ("use_single_vertex,s",
        "Use single vertex proposal distribution (defaults to vertices swap).")
    ("maximize,m",
        "Maximize likelihood instead of marginalizing.")
    ("cooling_schedule,c", po::value<std::string>(&cooling_schedule)->default_value("exponential"),
        "Cooling schedule for the simulated annealing algorithm. Options are exponential, linear, logarithmic and constant.")
    ("cooling_schedule_kwargs,a", po::value<float_vec_t>(&cooling_schedule_kwargs)->multitoken(),
        "Additional arguments for the cooling schedule provided as a list of floats. "\
        "Depends on the choice of schedule:\n"\
         "Exponential: T_0 (init. temperature > 0)\n"\
         "             alpha (in ]0,1[).\n"\
         "Linear: T_0 (init. temperature > 0)\n"\
         "        eta (rate of decline).\n"\
         "Logarithmic: c (rate of decline)\n"\
         "             d (delay > 1)\n"\
         "Constant: T (temperature > 0)")
    ("seed,d", po::value<unsigned int>(&seed),
        "Seed of the pseudo random number generator (Mersenne-twister 19937). A random seed is used if seed is not specified.")
    ("help,h", "Produce this help message.")
    ;
    po::variables_map var_map;
    po::store(po::parse_command_line(argc,argv,description), var_map);
    po::notify(var_map);
    if (var_map.count("help") > 0 || argc == 1) {
	#if OUTPUT_HISTORY == 0
		std::cout << "MCMC algorithms for the SBM (final output only)\n";
       	#else
		std::cout << "MCMC algorithms for the SBM (output intermediate states)\n";
	#endif
	std::cout << "Usage:\n"
                  << "  "+std::string(argv[0])+" [--option_1=value] [--option_s2=value] ...\n";
        std::cout << description;
        return 0;
    }
    if (var_map.count("edge_list_path") == 0) {
        std::cout << "edge_list_path is required (-e flag)\n";
        return 1;
    }
    if (var_map.count("n") == 0) {
        std::cout << "n is required (-n flag)\n";
        return 1;
    }
    if (var_map.count("randomize") > 0) {
        randomize = true;
    }
    if (var_map.count("use_ppm") > 0) {
        use_ppm = true;
    }
    if (var_map.count("use_single_vertex") > 0) {
        use_single_vertex = true;
    }
    if (var_map.count("maximize") > 0) {
        maximize = true;
        if (var_map.count("cooling_schedule_kwargs") == 0)
        {
          // defaults
          if (cooling_schedule == "exponential")
          {
            cooling_schedule_kwargs[0] = 1;
            cooling_schedule_kwargs[1] = 0.99;
          } 
          if (cooling_schedule == "linear")
          {
            cooling_schedule_kwargs[0] = sampling_steps + 1;
            cooling_schedule_kwargs[1] = 1;
          }
          if (cooling_schedule == "logarithmic")
          {
            cooling_schedule_kwargs[0] = 1;
            cooling_schedule_kwargs[1] = 1;
          }
          if (cooling_schedule == "constant")
          {
            cooling_schedule_kwargs[0] = 1;
          }
        }
        else
        {
          // kwards not defaulted, must check.
          if (cooling_schedule == "exponential")
          {
            if (cooling_schedule_kwargs[0] <= 0)
            {
              std::cerr << "Invalid cooling schedule argument for linear schedule: T_0 must be grater than 0.\n";
              std::cerr << "Passed value: T_0=" << cooling_schedule_kwargs[0] << "\n";
              return 1;
            }
            if (cooling_schedule_kwargs[1] <= 0 || cooling_schedule_kwargs[1] >= 1)
            {
              std::cerr << "Invalid cooling schedule argument for exponential schedule: alpha must be in ]0,1[.\n";
              std::cerr << "Passed value: alpha=" << cooling_schedule_kwargs[1] << "\n";
              return 1;
            }
          }
          else if (cooling_schedule == "linear")
          {
            if (cooling_schedule_kwargs[0] <= 0)
            {
              std::cerr << "Invalid cooling schedule argument for linear schedule: T_0 must be grater than 0.\n";
              std::cerr << "Passed value: T_0=" << cooling_schedule_kwargs[0] << "\n";
              return 1;
            }
            if (cooling_schedule_kwargs[1] <= 0 || cooling_schedule_kwargs[1] > cooling_schedule_kwargs[0])
            {
              std::cerr << "Invalid cooling schedule argument for linear schedule: eta must be in ]0, T_0].\n";
              std::cerr << "Passed value: T_0=" << cooling_schedule_kwargs[0]
                        << ", eta=" << cooling_schedule_kwargs[1] << "\n";
              return 1;
            }
            if (cooling_schedule_kwargs[1] * sampling_steps > cooling_schedule_kwargs[0])
            {
              std::cerr << "Invalid cooling schedule argument for linear schedule: eta * sampling_steps must be smaller or equal to T_0.\n";
              std::cerr << "Passed value: eta*sampling_steps=" << cooling_schedule_kwargs[1] * sampling_steps
                        << ", T_0=" << cooling_schedule_kwargs[0] << "\n";
              return 1;
            }
          }
          else if (cooling_schedule == "logarithmic")
          {
            if (cooling_schedule_kwargs[0] <= 0)
            {
              std::cerr << "Invalid cooling schedule argument for logarithmic schedule: c must be greater than 0.\n";
              std::cerr << "Passed value: c=" << cooling_schedule_kwargs[0] << "\n";
              return 1;
            }
            if (cooling_schedule_kwargs[1] <= 0)
            {
              std::cerr << "Invalid cooling schedule argument for logarithmic schedule: d must be greater than 0.\n";
              std::cerr << "Passed value: d=" << cooling_schedule_kwargs[1] << "\n";
              return 1;
            }
          }
          else if (cooling_schedule == "constant")
          {
            if (cooling_schedule_kwargs[0] <= 0)
            {
              std::cerr << "Invalid cooling schedule argument for constant schedule: temperature must be greater than 0.\n";
              std::cerr << "Passed value: T=" << cooling_schedule_kwargs[0] << "\n";
              return 1;
            }
          }
          else
          {
            std::cerr << "Invalid cooling schedule. Options are exponential, linear, logarithmic.\n";
            return 1;
          }
        }
    }
    if (var_map.count("seed") == 0) {
        // seeding based on the clock
        seed = (unsigned int) std::chrono::high_resolution_clock::now().time_since_epoch().count();
    }
    /* ~~~~~ Setup objects ~~~~~~~*/
    std::mt19937 engine(seed);
    // number of blocks
    unsigned int g = n.size();
    // number of vertices
    unsigned int N = 0;
    for (unsigned int i = 0; i < g; ++i) {
      N += n[i];
    }
    // Graph structure
    edge_list_t edge_list;
    load_edge_list(edge_list, edge_list_path);
    adj_list_t adj_list = edge_to_adj(edge_list, N);
    edge_list.clear();
    // memberships from block sizes
    uint_vec_t memberships_init;
    {
      unsigned int accu = 0;
      for (auto it = n.begin(); it != n.end(); ++it) {
          accu += *it;
      }
      memberships_init.resize(accu, 0);
      unsigned shift = 0;
      for (unsigned int r = 0; r < n.size(); ++r) {
          for (unsigned int i = 0; i < n[r]; ++i) {
              memberships_init[shift + i] = r;
          }
          shift += n[r];
      }
    }
    // blockmodel
    blockmodel_t blockmodel(memberships_init, g, adj_list.size(), &adj_list);
    memberships_init.clear();
    if (randomize) {
        blockmodel.shuffle(engine);
    }
    // probabilities
    float_mat_t p(g, float_vec_t(g, 0));
    if (!use_ppm)
    {
      for (unsigned int r = 0; r < g; ++r)
      {
        for (unsigned int s = 0; s < g; ++s)
        {
          p[r][s] = probabilities[s + r*g];
        }
      }
    }
    else
    {
      for (unsigned int r = 0; r < g; ++r)
      {
        p[r][r] = probabilities[0];
        for (unsigned int s = r + 1; s < g; ++s)
        {
          p[r][s] = probabilities[1];
          p[s][r] = probabilities[1];
        }
      }
    }
    // Bind proper Metropolis-Hasting algorithm
    std::shared_ptr<metropolis_hasting> algorithm;
    if (!use_ppm && use_single_vertex) {
        algorithm = std::make_shared<mh_single_vertex_sbm>();
    }
    else if (use_ppm && use_single_vertex) {
        algorithm = std::make_shared<mh_single_vertex_ppm>();    
    }
    else if (!use_ppm &&  !use_single_vertex) {
        algorithm = std::make_shared<mh_vertices_swap_sbm>();     
    }
    else if (use_ppm && !use_single_vertex) {
        algorithm = std::make_shared<mh_vertices_swap_ppm>();     
    }

    /* ~~~~~ Logging ~~~~~~~*/
    #if LOGGING == 1
    std::clog << "edge_list_path: " << edge_list_path << "\n";
    std::clog << "probabilities:\n";
    output_mat<float_mat_t>(p, std::clog);
    std::clog << "sizes (g=" << n.size() << "): ";
    for (auto it = n.begin(); it != n.end(); ++it)
        std::clog << *it << " ";
    std::clog << "\n";
    std::clog << "burn_in: " << burn_in << "\n";
    std::clog << "sampling_steps: " << sampling_steps << "\n";
    std::clog << "sampling_frequency: " << sampling_frequency << "\n";
    if (maximize) {std::clog << "maximize: true\n";}
    else {std::clog << "maximize: false\n";}
    if (use_ppm) {std::clog << "use_ppm: true\n";}
    else {std::clog << "use_ppm: false\n";}
    if (use_single_vertex) {std::clog << "use_single_vertex: true\n";}
    else {std::clog << "use_single_vertex: false\n";}
    if (randomize) {std::clog << "randomize: true\n";}
    else {std::clog << "randomize: false\n";}
    if (maximize)
    {
      std::clog << "cooling_schedule: " << cooling_schedule << "\n";
      std::clog << "cooling_schedule_kwargs: ";
      output_vec<float_vec_t>(cooling_schedule_kwargs);
    }
    std::clog << "seed: " << seed << "\n";
    #endif

    /* ~~~~~ Actual algorithm ~~~~~~~*/
    double rate = 0;
    uint_mat_t marginal(adj_list.size(), uint_vec_t(g, 0));
    if (maximize)
    {
      if (cooling_schedule == "exponential")
      {
        algorithm->anneal(blockmodel, p, &exponential_schedule, cooling_schedule_kwargs, sampling_steps, engine);
      }
      if (cooling_schedule == "linear")
      {
        algorithm->anneal(blockmodel, p, &linear_schedule, cooling_schedule_kwargs, sampling_steps, engine);
      }
      if (cooling_schedule == "logarithmic")
      {
        algorithm->anneal(blockmodel, p, &logarithmic_schedule, cooling_schedule_kwargs, sampling_steps, engine);
      }
      if (cooling_schedule == "constant")
      {
        algorithm->anneal(blockmodel, p, &constant_schedule, cooling_schedule_kwargs, sampling_steps, engine);
      }
      output_vec<uint_vec_t>(blockmodel.get_memberships(), std::cout);
    }
    else  // marginalize
    {  
      rate = algorithm->marginalize(blockmodel, marginal, p, burn_in, sampling_frequency, sampling_steps, engine);
      uint_vec_t memberships(blockmodel.get_N(), 0);
      for (unsigned int i = 0; i < blockmodel.get_N(); ++i)
      {
        unsigned int max = 0;
        for (unsigned int r = 0; r < g; ++r)
        {
          if (marginal[i][r] > max)
          {
            memberships[i] = r;
            max = marginal[i][r];
          }
        }
      }
      output_vec<uint_vec_t>(memberships, std::cout);
      std::clog << "acceptance ratio " <<  rate  <<  "\n";
    }
    return 0;
}